

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O1

DescriptorScriptData * __thiscall
cfd::AddressFactory::ParseOutputDescriptor
          (DescriptorScriptData *__return_storage_ptr__,AddressFactory *this,string *descriptor,
          string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  void *pvVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  AddressType AVar6;
  DescriptorScriptType DVar7;
  uint32_t uVar8;
  DescriptorKeyType DVar9;
  DescriptorKeyReference *key_ref_00;
  DescriptorKeyReference *key_ref_01;
  DescriptorKeyReference *key_ref_02;
  DescriptorKeyReference *key_ref_03;
  DescriptorKeyReference *key_ref_04;
  KeyData *key;
  undefined1 __x [8];
  pointer this_00;
  pointer pcVar10;
  undefined1 auVar11 [8];
  pointer this_01;
  uint32_t index;
  uint uVar12;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  DescriptorScriptReference child;
  DescriptorScriptData data;
  DescriptorKeyReference key_ref;
  Descriptor desc;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_14b0;
  AddressFactory *local_1498;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *local_1490;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1488;
  string *local_1470;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *local_1468;
  Script *local_1460;
  Address *local_1458;
  TapBranch *local_1450;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_1448;
  TapBranch *local_1440;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *local_1438;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_1430;
  string *local_1428;
  string *local_1420;
  Address *local_1418;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_1410;
  TapBranch *local_1408;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_1400;
  TapBranch *local_13f8;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *local_13f0;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_13e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13c8;
  undefined1 local_13a8 [8];
  undefined1 auStack_13a0 [8];
  undefined1 local_1398 [8];
  undefined1 local_1390 [48];
  undefined1 local_1360 [24];
  pointer local_1348;
  undefined8 local_1338;
  pointer local_1330;
  undefined1 local_1328 [328];
  uint8_t local_11e0 [4];
  Script local_11d8;
  undefined1 local_11a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1188;
  undefined1 local_1170 [128];
  undefined1 local_10f0 [128];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1070;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_1058;
  undefined1 local_1038 [16];
  undefined1 local_1028 [112];
  Address AStack_fb8;
  TapBranch TStack_e30;
  TapBranch local_da8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> vStack_d28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d08;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  vStack_d00;
  string asStack_ce8 [32];
  DescriptorKeyReference *local_cc8;
  undefined1 auStack_cc0 [64];
  Script local_c80;
  Address local_c48;
  TapBranch local_ac0;
  TapBranch local_a38;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_9b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_990;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_978;
  undefined1 local_960 [528];
  _Alloc_hider local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  uint32_t local_730;
  TapBranch local_728;
  TapBranch local_6a8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_628;
  DescriptorKeyReference local_610;
  DescriptorNode local_310;
  DescriptorNode local_1a0;
  
  local_1498 = this;
  local_1468 = multisig_key_list;
  if (script_list !=
      (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
    _M_erase_at_end(script_list,
                    (script_list->
                    super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  }
  local_1490 = script_list;
  if (local_1468 != (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0)
  {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::_M_erase_at_end
              (local_1468,
               (local_1468->
               super__Vector_base<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>).
               _M_impl.super__Vector_impl_data._M_start);
  }
  DescriptorScriptData::DescriptorScriptData(__return_storage_ptr__);
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->multisig_req_sig_num = 0;
  core::Descriptor::Parse
            ((Descriptor *)&local_310,descriptor,&local_1498->prefix_list_,local_1498->type_);
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar12 = 0; uVar5 = core::Descriptor::GetNeedArgumentNum((Descriptor *)&local_310),
      uVar12 < uVar5; uVar12 = uVar12 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_13c8,bip32_derivation_path);
  }
  if (key_list != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_13a8,
               (Descriptor *)&local_310,&local_13c8);
    auVar11 = auStack_13a0;
    for (__x = local_13a8; __x != auVar11;
        __x = (undefined1  [8])&(((DescriptorKeyReference *)__x)->key_data_).privkey_.is_compressed_
        ) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (key_list,(value_type *)__x);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_13a8);
  }
  core::Descriptor::GetReferenceAll(&local_14b0,(Descriptor *)&local_310,&local_13c8);
  core::Descriptor::GetNode(&local_1a0,(Descriptor *)&local_310);
  __return_storage_ptr__->type = local_1a0.script_type_;
  __return_storage_ptr__->key_type = kDescriptorKeyNull;
  __return_storage_ptr__->depth = 0;
  core::DescriptorScriptReference::GetLockingScript
            ((Script *)local_13a8,
             local_14b0.
             super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ._M_impl.super__Vector_impl_data._M_start);
  core::Script::operator=(&__return_storage_ptr__->locking_script,(Script *)local_13a8);
  core::Script::~Script((Script *)local_13a8);
  bVar3 = core::DescriptorScriptReference::HasAddress
                    (local_14b0.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar3) {
    core::DescriptorScriptReference::GenerateAddress
              ((Address *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start,local_1498->type_);
    core::Address::operator=(&__return_storage_ptr__->address,(Address *)local_13a8);
    core::Address::~Address((Address *)local_13a8);
    AVar6 = core::DescriptorScriptReference::GetAddressType
                      (local_14b0.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->address_type = AVar6;
  }
  bVar3 = core::DescriptorScriptReference::HasRedeemScript
                    (local_14b0.
                     super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar3) {
    core::DescriptorScriptReference::GetRedeemScript
              ((Script *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Script::operator=(&__return_storage_ptr__->redeem_script,(Script *)local_13a8);
    core::Script::~Script((Script *)local_13a8);
  }
  local_1488.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
  local_1488.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
  local_1488.
  super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::DescriptorKeyReference::DescriptorKeyReference(&local_610);
  switch(__return_storage_ptr__->type) {
  case kDescriptorScriptSh:
  case kDescriptorScriptWsh:
    core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar3 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_13a8);
    if (bVar3) {
      core::Script::Script((Script *)local_1038);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript
                ((Script *)local_1038,(DescriptorScriptReference *)local_13a8);
    }
    local_1460 = &__return_storage_ptr__->redeem_script;
    core::Script::operator=(local_1460,(Script *)local_1038);
    core::Script::~Script((Script *)local_1038);
    if (bVar3) {
      local_1430 = &local_978;
      local_1438 = &local_990;
      local_1440 = &local_a38;
      local_1448 = &local_9b8;
      local_1450 = &local_ac0;
      local_1420 = (string *)&local_750;
      local_1428 = (string *)&__return_storage_ptr__->key;
      local_1410 = &local_628;
      local_1470 = asStack_ce8;
      local_13f0 = &vStack_d00;
      local_13f8 = &local_da8;
      local_1400 = &vStack_d28;
      local_1408 = &TStack_e30;
      local_1458 = &local_c48;
      local_1418 = &AStack_fb8;
      uVar5 = 0;
      uVar8 = 0;
      do {
        core::DescriptorScriptReference::DescriptorScriptReference
                  ((DescriptorScriptReference *)local_1038);
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_960);
        DVar7 = core::DescriptorScriptReference::GetScriptType
                          ((DescriptorScriptReference *)local_13a8);
        if (DVar7 - kDescriptorScriptSh < 2) {
          bVar4 = core::DescriptorScriptReference::HasChild((DescriptorScriptReference *)local_13a8)
          ;
          if (bVar4) {
            core::DescriptorScriptReference::GetChild
                      ((DescriptorScriptReference *)&local_cc8,
                       (DescriptorScriptReference *)local_13a8);
            core::DescriptorScriptReference::operator=
                      ((DescriptorScriptReference *)local_1038,
                       (DescriptorScriptReference *)&local_cc8);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector(local_1430);
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::~vector(local_1438);
            if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
            }
            local_a38._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
            std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                      (local_1448);
            core::TapBranch::~TapBranch(local_1440);
            core::TapBranch::~TapBranch(local_1450);
            core::Address::~Address(local_1458);
            core::Script::~Script(&local_c80);
            core::Script::~Script((Script *)auStack_cc0);
            DVar7 = core::DescriptorScriptReference::GetScriptType
                              ((DescriptorScriptReference *)local_1038);
            if ((DVar7 == kDescriptorScriptMulti) ||
               (DVar7 = core::DescriptorScriptReference::GetScriptType
                                  ((DescriptorScriptReference *)local_1038),
               DVar7 == kDescriptorScriptSortedMulti)) {
              core::DescriptorScriptReference::GetKeyList
                        (&local_13e8,(DescriptorScriptReference *)local_1038);
              auStack_cc0._8_8_ =
                   local_1488.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              auStack_cc0._0_8_ =
                   local_1488.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_cc8 = local_1488.
                          super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_1488.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_13e8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1488.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_13e8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_1488.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_13e8.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_13e8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start = (DescriptorKeyReference *)0x0;
              local_13e8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_finish = (DescriptorKeyReference *)0x0;
              local_13e8.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)&local_cc8);
              std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::~vector(&local_13e8);
              uVar8 = core::DescriptorScriptReference::GetReqNum
                                ((DescriptorScriptReference *)local_1038);
              __return_storage_ptr__->multisig_req_sig_num = uVar8;
              bVar3 = false;
            }
            else {
              DVar7 = core::DescriptorScriptReference::GetScriptType
                                ((DescriptorScriptReference *)local_1038);
              if (DVar7 == kDescriptorScriptMiniscript) {
                bVar3 = false;
              }
            }
            DVar7 = core::DescriptorScriptReference::GetScriptType
                              ((DescriptorScriptReference *)local_1038);
            if (DVar7 == kDescriptorScriptWpkh) goto LAB_003e467e;
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_cc8,(DescriptorScriptReference *)local_13a8);
            core::Script::operator=(local_1460,(Script *)&local_cc8);
          }
          else {
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)&local_cc8,(DescriptorScriptReference *)local_13a8);
            core::Script::operator=(local_1460,(Script *)&local_cc8);
          }
          core::Script::~Script((Script *)&local_cc8);
        }
        else {
          bVar3 = false;
        }
LAB_003e467e:
        local_960._0_4_ =
             core::DescriptorScriptReference::GetScriptType((DescriptorScriptReference *)local_13a8)
        ;
        local_960._64_4_ = uVar5;
        core::DescriptorScriptReference::GetLockingScript
                  ((Script *)&local_cc8,(DescriptorScriptReference *)local_13a8);
        core::Script::operator=((Script *)(local_960 + 8),(Script *)&local_cc8);
        core::Script::~Script((Script *)&local_cc8);
        core::DescriptorScriptReference::GenerateAddress
                  ((Address *)&local_cc8,(DescriptorScriptReference *)local_13a8,local_1498->type_);
        core::Address::operator=((Address *)(local_960 + 0x48),(Address *)&local_cc8);
        core::Address::~Address((Address *)&local_cc8);
        local_960._456_4_ =
             core::DescriptorScriptReference::GetAddressType
                       ((DescriptorScriptReference *)local_13a8);
        bVar4 = core::DescriptorScriptReference::HasRedeemScript
                          ((DescriptorScriptReference *)local_13a8);
        if (bVar4) {
          core::DescriptorScriptReference::GetRedeemScript
                    ((Script *)&local_cc8,(DescriptorScriptReference *)local_13a8);
          core::Script::operator=((Script *)(local_960 + 0x1d0),(Script *)&local_cc8);
          core::Script::~Script((Script *)&local_cc8);
        }
        bVar4 = core::DescriptorScriptReference::HasKey((DescriptorScriptReference *)local_13a8);
        if (bVar4) {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)&local_cc8,(DescriptorScriptReference *)local_13a8);
          core::DescriptorKeyReference::operator=(&local_610,local_cc8);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)&local_cc8);
          local_960._520_4_ = core::DescriptorKeyReference::GetKeyType(&local_610);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_cc8,&local_610,key_ref_02);
          std::__cxx11::string::operator=(local_1420,(string *)&local_cc8);
          if (local_cc8 != (DescriptorKeyReference *)(auStack_cc0 + 8)) {
            operator_delete(local_cc8,
                            (ulong)((long)&(((Pubkey *)auStack_cc0._8_8_)->data_).data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          DVar9 = core::DescriptorKeyReference::GetKeyType(&local_610);
          __return_storage_ptr__->key_type = DVar9;
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)&local_cc8,&local_610,key_ref_03);
          std::__cxx11::string::operator=(local_1428,(string *)&local_cc8);
          if (local_cc8 != (DescriptorKeyReference *)(auStack_cc0 + 8)) {
            operator_delete(local_cc8,
                            (ulong)((long)&(((Pubkey *)auStack_cc0._8_8_)->data_).data_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
        }
        else {
          local_960._520_4_ = kDescriptorKeyNull;
        }
        local_730 = uVar8;
        if (local_1490 !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(local_1490,(value_type *)local_960);
        }
        if ((bVar3 == false) ||
           (bVar4 = core::DescriptorScriptReference::HasChild
                              ((DescriptorScriptReference *)local_13a8), !bVar4)) {
          bVar3 = false;
        }
        else {
          core::DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)&local_cc8,(DescriptorScriptReference *)local_13a8
                    );
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_1038,(DescriptorScriptReference *)&local_cc8
                    );
          std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
          ~vector(local_1430);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector(local_1438);
          if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
          }
          local_a38._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (local_1448);
          core::TapBranch::~TapBranch(local_1440);
          core::TapBranch::~TapBranch(local_1450);
          core::Address::~Address(local_1458);
          core::Script::~Script(&local_c80);
          core::Script::~Script((Script *)auStack_cc0);
          core::DescriptorScriptReference::operator=
                    ((DescriptorScriptReference *)local_13a8,(DescriptorScriptReference *)local_1038
                    );
          uVar5 = uVar5 + 1;
        }
        local_6a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (local_1410);
        core::TapBranch::~TapBranch(&local_6a8);
        core::TapBranch::~TapBranch(&local_728);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_750._M_p != &local_740) {
          operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
        }
        core::Script::~Script((Script *)(local_960 + 0x1d0));
        core::Address::~Address((Address *)(local_960 + 0x48));
        core::Script::~Script((Script *)(local_960 + 8));
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)local_1470);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector(local_13f0);
        if (local_d08._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d08._M_pi);
        }
        local_da8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00888598;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (local_1400);
        core::TapBranch::~TapBranch(local_13f8);
        core::TapBranch::~TapBranch(local_1408);
        core::Address::~Address(local_1418);
        core::Script::~Script((Script *)(local_1028 + 0x38));
        core::Script::~Script((Script *)(local_1038 + 8));
      } while (bVar3 != false);
    }
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_1058);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)&local_1070);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10f0._120_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10f0._120_8_);
    }
    local_1170._88_8_ = &PTR__TaprootScriptTree_00888598;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               (local_10f0 + 0x58));
    core::TapBranch::~TapBranch((TapBranch *)(local_1170 + 0x58));
    core::TapBranch::~TapBranch((TapBranch *)local_11a0);
    core::Address::~Address((Address *)local_1328);
    core::Script::~Script((Script *)local_1360);
    core::Script::~Script((Script *)auStack_13a0);
    break;
  case kDescriptorScriptPk:
  case kDescriptorScriptPkh:
  case kDescriptorScriptWpkh:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=(&local_610,(DescriptorKeyReference *)local_13a8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_13a8);
    DVar9 = core::DescriptorKeyReference::GetKeyType(&local_610);
    __return_storage_ptr__->key_type = DVar9;
    const::$_0::operator()::DescriptorKeyReference_const___const
              ((string *)local_13a8,&local_610,key_ref_00);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_13a8);
    if (local_13a8 == (undefined1  [8])local_1398) break;
    pcVar10 = (pointer)((long)local_1398 + 1);
    auVar11 = local_13a8;
    goto LAB_003e4c36;
  case kDescriptorScriptCombo:
    if (local_14b0.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_14b0.
        super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1470 = (string *)&__return_storage_ptr__->key;
      this_01 = local_14b0.
                super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        DescriptorScriptData::DescriptorScriptData((DescriptorScriptData *)local_13a8);
        DVar7 = core::DescriptorScriptReference::GetScriptType(this_01);
        local_13a8._0_4_ = DVar7;
        local_1390._40_4_ = 0;
        core::DescriptorScriptReference::GetLockingScript((Script *)local_1038,this_01);
        core::Script::operator=((Script *)auStack_13a0,(Script *)local_1038);
        core::Script::~Script((Script *)local_1038);
        bVar3 = core::DescriptorScriptReference::HasAddress(this_01);
        if (bVar3) {
          core::DescriptorScriptReference::GenerateAddress
                    ((Address *)local_1038,this_01,local_1498->type_);
          core::Address::operator=((Address *)local_1360,(Address *)local_1038);
          core::Address::~Address((Address *)local_1038);
          local_11e0 = (uint8_t  [4])core::DescriptorScriptReference::GetAddressType(this_01);
        }
        else {
          local_11e0[0] = '\x01';
          local_11e0[1] = '\0';
          local_11e0[2] = '\0';
          local_11e0[3] = '\0';
        }
        bVar3 = core::DescriptorScriptReference::HasRedeemScript(this_01);
        if (bVar3) {
          core::DescriptorScriptReference::GetRedeemScript((Script *)local_1038,this_01);
          core::Script::operator=(&local_11d8,(Script *)local_1038);
          core::Script::~Script((Script *)local_1038);
          local_11a0._0_4_ = kDescriptorKeyNull;
        }
        else {
          core::DescriptorScriptReference::GetKeyList
                    ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)local_1038,this_01);
          core::DescriptorKeyReference::operator=
                    (&local_610,(DescriptorKeyReference *)local_1038._0_8_);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)local_1038);
          local_11a0._0_4_ = core::DescriptorKeyReference::GetKeyType(&local_610);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    ((string *)local_1038,&local_610,key_ref_01);
          std::__cxx11::string::operator=((string *)(local_11a0 + 8),(string *)local_1038);
          if ((DescriptorKeyReference *)local_1038._0_8_ != (DescriptorKeyReference *)local_1028) {
            operator_delete((void *)local_1038._0_8_,(ulong)(local_1028._0_8_ + 1));
          }
          if (__return_storage_ptr__->key_type == kDescriptorKeyNull) {
            __return_storage_ptr__->key_type = local_11a0._0_4_;
            std::__cxx11::string::_M_assign(local_1470);
          }
        }
        if (local_1490 !=
            (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back(local_1490,(DescriptorScriptData *)local_13a8);
        }
        local_10f0._0_8_ = &PTR__TaprootScriptTree_00888598;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_1070);
        core::TapBranch::~TapBranch((TapBranch *)local_10f0);
        core::TapBranch::~TapBranch((TapBranch *)local_1170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_11a0._8_8_ != &local_1188) {
          operator_delete((void *)local_11a0._8_8_,local_1188._M_allocated_capacity + 1);
        }
        core::Script::~Script(&local_11d8);
        core::Address::~Address((Address *)local_1360);
        core::Script::~Script((Script *)auStack_13a0);
        this_01 = this_01 + 1;
      } while (this_01 !=
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    break;
  case kDescriptorScriptMulti:
  case kDescriptorScriptSortedMulti:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_1038,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_1398 = (undefined1  [8])
                 local_1488.
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_13a0 = (undefined1  [8])
                   local_1488.
                   super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_13a8 = (undefined1  [8])
                 local_1488.
                 super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_1488.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1038._0_8_;
    local_1488.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1038._8_8_;
    local_1488.
    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1028._0_8_;
    local_1038._0_8_ = (DescriptorKeyReference *)0x0;
    local_1038._8_8_ = (DescriptorKeyReference *)0x0;
    local_1028._0_8_ = (pointer)0x0;
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_13a8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_1038);
    uVar5 = core::DescriptorScriptReference::GetReqNum
                      (local_14b0.
                       super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    __return_storage_ptr__->multisig_req_sig_num = uVar5;
    break;
  case kDescriptorScriptTaproot:
    core::DescriptorScriptReference::GetKeyList
              ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::DescriptorKeyReference::operator=(&local_610,(DescriptorKeyReference *)local_13a8);
    std::
    vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
    ~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)local_13a8);
    core::DescriptorScriptReference::GetTapBranch
              ((TapBranch *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TapBranch::operator=(&__return_storage_ptr__->branch,(TapBranch *)local_13a8);
    core::TapBranch::~TapBranch((TapBranch *)local_13a8);
    core::DescriptorScriptReference::GetScriptTree
              ((TaprootScriptTree *)local_13a8,
               local_14b0.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::TaprootScriptTree::operator=
              (&__return_storage_ptr__->tree,(TaprootScriptTree *)local_13a8);
    local_13a8 = (undefined1  [8])&PTR__TaprootScriptTree_00888598;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1328
              );
    core::TapBranch::~TapBranch((TapBranch *)local_13a8);
    DVar9 = core::DescriptorKeyReference::GetKeyType(&local_610);
    __return_storage_ptr__->key_type = DVar9;
    bVar3 = core::DescriptorKeyReference::HasExtPrivkey(&local_610);
    if (bVar3) {
      core::DescriptorKeyReference::GetExtPrivkey((ExtPrivkey *)local_13a8,&local_610);
      core::Extkey::ToString_abi_cxx11_((string *)local_1038,(Extkey *)local_13a8);
LAB_003e4adb:
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_1038);
      if ((DescriptorKeyReference *)local_1038._0_8_ != (DescriptorKeyReference *)local_1028) {
        operator_delete((void *)local_1038._0_8_,(ulong)(local_1028._0_8_ + 1));
      }
      if (local_1330 != (pointer)0x0) {
        operator_delete(local_1330,local_1328._8_8_ - (long)local_1330);
      }
      if (local_1348 != (pointer)0x0) {
        operator_delete(local_1348,local_1338 - (long)local_1348);
      }
      pvVar1 = (void *)CONCAT44(local_1390._44_4_,local_1390._40_4_);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_1360._8_8_ - (long)pvVar1);
      }
      auVar11 = auStack_13a0;
      pDVar2 = (pointer)local_1390._0_8_;
      if ((pointer)local_1390._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_1390._16_8_,local_1390._32_8_ - local_1390._16_8_);
        auVar11 = auStack_13a0;
        pDVar2 = (pointer)local_1390._0_8_;
      }
    }
    else {
      bVar3 = core::DescriptorKeyReference::HasExtPubkey(&local_610);
      if (bVar3) {
        core::DescriptorKeyReference::GetExtPubkey((ExtPubkey *)local_13a8,&local_610);
        core::Extkey::ToString_abi_cxx11_((string *)local_1038,(Extkey *)local_13a8);
        goto LAB_003e4adb;
      }
      __return_storage_ptr__->key_type = kDescriptorKeySchnorr;
      core::DescriptorKeyReference::GetSchnorrPubkey((SchnorrPubkey *)local_1038,&local_610);
      core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_13a8,(SchnorrPubkey *)local_1038);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)local_13a8);
      auVar11 = (undefined1  [8])local_1038._0_8_;
      pDVar2 = (pointer)local_1028._0_8_;
      if (local_13a8 != (undefined1  [8])local_1398) {
        operator_delete((void *)local_13a8,(ulong)((long)local_1398 + 1));
        auVar11 = (undefined1  [8])local_1038._0_8_;
        pDVar2 = (pointer)local_1028._0_8_;
      }
    }
    if (auVar11 == (undefined1  [8])0x0) break;
    pcVar10 = (pointer)((long)pDVar2 - (long)auVar11);
LAB_003e4c36:
    operator_delete((void *)auVar11,(ulong)pcVar10);
  }
  pDVar2 = local_1488.
           super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1488.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1488.
      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      local_1468 != (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0)
  {
    this_00 = local_1488.
              super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      DVar9 = core::DescriptorKeyReference::GetKeyType(this_00);
      local_13a8._0_4_ = DVar9;
      const::$_0::operator()::DescriptorKeyReference_const___const
                ((string *)auStack_13a0,this_00,key_ref_04);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                (local_1468,(value_type *)local_13a8);
      if (auStack_13a0 != (undefined1  [8])local_1390) {
        operator_delete((void *)auStack_13a0,(ulong)(local_1390._0_8_ + 1));
      }
      this_00 = this_00 + 1;
    } while (this_00 != pDVar2);
  }
  core::DescriptorKeyReference::~DescriptorKeyReference(&local_610);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&local_1488);
  core::DescriptorNode::~DescriptorNode(&local_1a0);
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_14b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_13c8);
  core::DescriptorNode::~DescriptorNode(&local_310);
  return __return_storage_ptr__;
}

Assistant:

DescriptorScriptData AddressFactory::ParseOutputDescriptor(
    const std::string& descriptor, const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    std::vector<KeyData>* key_list) const {
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &prefix_list_, type_);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(type_);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(type_);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      key_ref = script_refs[0].GetKeyList()[0];
      result.branch = script_refs[0].GetTapBranch();
      result.tree = script_refs[0].GetScriptTree();
      result.key_type = key_ref.GetKeyType();
      if (key_ref.HasExtPrivkey()) {
        result.key = key_ref.GetExtPrivkey().ToString();
      } else if (key_ref.HasExtPubkey()) {
        result.key = key_ref.GetExtPubkey().ToString();
      } else {
        result.key_type = DescriptorKeyType::kDescriptorKeySchnorr;
        result.key = key_ref.GetSchnorrPubkey().GetHex();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(type_);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}